

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_debugInfo_line_advanceLineAndPC
               (sysbvm_dwarf_debugInfo_builder_t *builder,int deltaLine,int deltaPC)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined1 local_1a;
  undefined1 local_19;
  
  iVar4 = (int)(builder->lineProgramHeader).lineBase;
  if (((deltaLine < iVar4) ||
      (bVar2 = (builder->lineProgramHeader).lineRange, (int)(uint)bVar2 <= deltaLine - iVar4)) ||
     (uVar3 = (uint)(builder->lineProgramHeader).opcodeBase +
              (deltaLine - iVar4) +
              (deltaPC / (builder->lineProgramHeader).minimumInstructionLength) * (uint)bVar2,
     0xff < uVar3)) {
    sysbvm_dwarf_debugInfo_line_advanceLine(builder,deltaLine);
    sysbvm_dwarf_debugInfo_line_advancePC(builder,deltaPC);
    local_19 = 1;
    sysbvm_dynarray_addAll(&builder->line,1,&local_19);
    (builder->lineProgramState).regDiscriminator = false;
    (builder->lineProgramState).regBasicBlock = false;
    (builder->lineProgramState).regPrologueEnd = false;
    (builder->lineProgramState).regEpilogueBegin = false;
  }
  else {
    local_1a = (undefined1)uVar3;
    sysbvm_dynarray_addAll(&builder->line,1,&local_1a);
    puVar1 = &(builder->lineProgramState).regLine;
    *puVar1 = *puVar1 + deltaLine;
    (builder->lineProgramState).regAddress = (builder->lineProgramState).regAddress + deltaPC;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_line_advanceLineAndPC(sysbvm_dwarf_debugInfo_builder_t *builder, int deltaLine, int deltaPC)
{
    int operationAdvance = deltaPC / builder->lineProgramHeader.minimumInstructionLength;

    int opcode = (deltaLine - builder->lineProgramHeader.lineBase) + (builder->lineProgramHeader.lineRange * operationAdvance) + builder->lineProgramHeader.opcodeBase;
    if( (0 <= opcode) && (opcode <= 255) 
        && (deltaLine - builder->lineProgramHeader.lineBase < builder->lineProgramHeader.lineRange)
        && (deltaLine >= builder->lineProgramHeader.lineBase) )
    {
        sysbvm_dwarf_encodeByte(&builder->line, opcode);
        builder->lineProgramState.regLine += deltaLine;
        builder->lineProgramState.regAddress += deltaPC;
    }
    else
    {
        sysbvm_dwarf_debugInfo_line_advanceLine(builder, deltaLine);
        sysbvm_dwarf_debugInfo_line_advancePC(builder, deltaPC);
        sysbvm_dwarf_debugInfo_line_copyRow(builder);
    }
}